

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

int uv_os_gethostname(char *buffer,size_t *size)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  size_t len;
  char buf [65];
  size_t *size_local;
  char *buffer_local;
  
  if (((buffer == (char *)0x0) || (size == (size_t *)0x0)) || (*size == 0)) {
    buffer_local._4_4_ = -0x16;
  }
  else {
    unique0x10000095 = size;
    iVar1 = gethostname((char *)&len,0x41);
    if (iVar1 == 0) {
      buf[0x38] = '\0';
      sVar3 = strlen((char *)&len);
      if (sVar3 < *stack0xffffffffffffffe0) {
        memcpy(buffer,&len,sVar3 + 1);
        *stack0xffffffffffffffe0 = sVar3;
        buffer_local._4_4_ = 0;
      }
      else {
        *stack0xffffffffffffffe0 = sVar3 + 1;
        buffer_local._4_4_ = -0x69;
      }
    }
    else {
      piVar2 = __errno_location();
      buffer_local._4_4_ = -*piVar2;
    }
  }
  return buffer_local._4_4_;
}

Assistant:

int uv_os_gethostname(char* buffer, size_t* size) {
  /*
    On some platforms, if the input buffer is not large enough, gethostname()
    succeeds, but truncates the result. libuv can detect this and return ENOBUFS
    instead by creating a large enough buffer and comparing the hostname length
    to the size input.
  */
  char buf[MAXHOSTNAMELEN + 1];
  size_t len;

  if (buffer == NULL || size == NULL || *size == 0)
    return -EINVAL;

  if (gethostname(buf, sizeof(buf)) != 0)
    return -errno;

  buf[sizeof(buf) - 1] = '\0'; /* Null terminate, just to be safe. */
  len = strlen(buf);

  if (len >= *size) {
    *size = len + 1;
    return -ENOBUFS;
  }

  memcpy(buffer, buf, len + 1);
  *size = len;
  return 0;
}